

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJacobiEigenSolver.cpp
# Opt level: O0

void verifyOrthonormal<Imath_3_2::Matrix44<float>>(Matrix44<float> *A,BaseType_conflict2 threshold)

{
  uint uVar1;
  uint uVar2;
  Matrix44<float> *in_RDI;
  Matrix44<float> *pMVar3;
  float in_XMM0_Da;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  uint j;
  uint i;
  Matrix44<float> prod;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  uint uVar4;
  uint local_90;
  Matrix44<float> *in_stack_ffffffffffffff98;
  Matrix44<float> local_4c;
  float local_c;
  
  local_c = in_XMM0_Da;
  Imath_3_2::Matrix44<float>::transposed(in_stack_ffffffffffffff98);
  Imath_3_2::Matrix44<float>::operator*
            ((Matrix44<float> *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),in_RDI
            );
  local_90 = 0;
  do {
    uVar1 = Imath_3_2::Matrix44<float>::dimensions();
    if (uVar1 <= local_90) {
      return;
    }
    uVar1 = 0;
    while (uVar4 = uVar1, uVar2 = Imath_3_2::Matrix44<float>::dimensions(), uVar1 < uVar2) {
      if (local_90 == uVar4) {
        pMVar3 = &local_4c;
        Imath_3_2::Matrix44<float>::operator[](pMVar3,local_90);
        std::abs((int)pMVar3);
        if (local_c <= extraout_XMM0_Da) {
          __assert_fail("std::abs (prod[i][j] - 1) < threshold",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                        ,0x3c,
                        "void verifyOrthonormal(const TM &, const typename TM::BaseType) [TM = Imath_3_2::Matrix44<float>]"
                       );
        }
      }
      else {
        pMVar3 = &local_4c;
        Imath_3_2::Matrix44<float>::operator[](pMVar3,local_90);
        std::abs((int)pMVar3);
        if (local_c <= extraout_XMM0_Da_00) {
          __assert_fail("std::abs (prod[i][j]) < threshold",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                        ,0x3e,
                        "void verifyOrthonormal(const TM &, const typename TM::BaseType) [TM = Imath_3_2::Matrix44<float>]"
                       );
        }
      }
      uVar1 = uVar4 + 1;
    }
    local_90 = local_90 + 1;
  } while( true );
}

Assistant:

void
verifyOrthonormal (const TM& A, const typename TM::BaseType threshold)
{
    const TM prod = A * A.transposed ();
    for (unsigned int i = 0; i < TM::dimensions (); ++i)
        for (unsigned int j = 0; j < TM::dimensions (); ++j)
            if (i == j)
                assert (std::abs (prod[i][j] - 1) < threshold);
            else
                assert (std::abs (prod[i][j]) < threshold);
}